

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  long lVar1;
  int iVar2;
  stbi_uc *psVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  stbi_uc *psVar7;
  long *in_FS_OFFSET;
  
  psVar7 = s->img_buffer;
  if (s->img_buffer_end <= psVar7) {
    if (s->read_from_callbacks == 0) goto LAB_001be10d;
    stbi__refill_buffer(s);
    psVar7 = s->img_buffer;
  }
  psVar3 = psVar7 + 1;
  s->img_buffer = psVar3;
  if (*psVar7 != 'G') {
LAB_001be10d:
    *(char **)(*in_FS_OFFSET + -0x20) = "not GIF";
    return 0;
  }
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_001be10d;
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
  }
  psVar7 = psVar3 + 1;
  s->img_buffer = psVar7;
  if (*psVar3 != 'I') goto LAB_001be10d;
  if (s->img_buffer_end <= psVar7) {
    if (s->read_from_callbacks == 0) goto LAB_001be10d;
    stbi__refill_buffer(s);
    psVar7 = s->img_buffer;
  }
  psVar3 = psVar7 + 1;
  s->img_buffer = psVar3;
  if (*psVar7 != 'F') goto LAB_001be10d;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_001be10d;
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
  }
  psVar7 = psVar3 + 1;
  s->img_buffer = psVar7;
  if (*psVar3 != '8') goto LAB_001be10d;
  if (s->img_buffer_end <= psVar7) {
    if (s->read_from_callbacks == 0) goto LAB_001be10d;
    stbi__refill_buffer(s);
    psVar7 = s->img_buffer;
  }
  psVar3 = psVar7 + 1;
  s->img_buffer = psVar3;
  if ((*psVar7 != '7') && (*psVar7 != '9')) goto LAB_001be10d;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) goto LAB_001be10d;
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  if (*psVar3 != 'a') goto LAB_001be10d;
  lVar1 = *in_FS_OFFSET;
  *(char **)(lVar1 + -0x20) = "";
  iVar2 = stbi__get16le(s);
  g->w = iVar2;
  iVar2 = stbi__get16le(s);
  g->h = iVar2;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_001be05a:
    s->img_buffer = pbVar4 + 1;
    uVar6 = (uint)*pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_001be05a;
    }
    uVar6 = 0;
  }
  g->flags = uVar6;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_001be095:
    s->img_buffer = pbVar4 + 1;
    uVar6 = (uint)*pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_001be095;
    }
    uVar6 = 0;
  }
  g->bgindex = uVar6;
  pbVar4 = s->img_buffer;
  if (s->img_buffer_end <= pbVar4) {
    if (s->read_from_callbacks == 0) {
      uVar6 = 0;
      goto LAB_001be0de;
    }
    stbi__refill_buffer(s);
    pbVar4 = s->img_buffer;
  }
  s->img_buffer = pbVar4 + 1;
  uVar6 = (uint)*pbVar4;
LAB_001be0de:
  g->ratio = uVar6;
  g->transparent = -1;
  if ((0x1000000 < g->w) || (0x1000000 < g->h)) {
    *(char **)(lVar1 + -0x20) = "too large";
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = 4;
  }
  if (is_info == 0) {
    bVar5 = (byte)g->flags;
    if ((char)bVar5 < '\0') {
      stbi__gif_parse_colortable(s,g->pal,2 << (bVar5 & 7),-1);
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}